

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O3

MidiEventList * __thiscall smf::MidiEventList::operator=(MidiEventList *this,MidiEventList *other)

{
  pointer ppMVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  pointer ppMVar4;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppMVar2 = (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppMVar3 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppMVar4 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppMVar2;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppMVar3;
  (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppMVar4;
  (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppMVar1;
  return this;
}

Assistant:

MidiEventList& MidiEventList::operator=(MidiEventList& other) {
	list.swap(other.list);
	return *this;
}